

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O0

int __thiscall PianoWidget::getNoteFromMouse(PianoWidget *this,QPoint mousePos)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_3c;
  int local_38;
  int note;
  int wkeyx;
  int bkeyInOctave;
  int octave;
  int wkeyInOctave;
  bool isBlack;
  int y;
  int x;
  PianoWidget *this_local;
  QPoint mousePos_local;
  
  this_local = (PianoWidget *)mousePos;
  iVar3 = QPoint::x((QPoint *)&this_local);
  iVar4 = QPoint::y((QPoint *)&this_local);
  bVar2 = false;
  iVar5 = (iVar3 / 0xc) % 7;
  note = 0;
  if (iVar4 < 0x2a) {
    note = *(int *)(PianoWidgetTU::BLACKKEY_LEFTOF + (long)iVar5 * 4);
    if ((note == -1) || (4 < iVar3 % 0xc)) {
      if (iVar5 == 6) {
        local_3c = 0;
      }
      else {
        local_3c = iVar5 + 1;
      }
      note = *(int *)(PianoWidgetTU::BLACKKEY_LEFTOF + (long)local_3c * 4);
      if ((note != -1) && (7 < iVar3 % 0xc)) {
        bVar2 = true;
      }
    }
    else {
      bVar2 = true;
    }
  }
  if (bVar2) {
    bVar1 = *(byte *)((long)&PianoWidgetTU::BLACKKEY_TO_NOTE + (long)note);
  }
  else {
    bVar1 = *(byte *)((long)&PianoWidgetTU::WHITEKEY_TO_NOTE + (long)iVar5);
  }
  local_38 = (uint)bVar1 + ((iVar3 / 0xc) / 7) * 0xc;
  return local_38;
}

Assistant:

int PianoWidget::getNoteFromMouse(QPoint mousePos) {
    auto const x = mousePos.x();
    auto const y = mousePos.y();

    bool isBlack = false;
    int wkeyInOctave = x / TU::WKEY_WIDTH;
    int octave = wkeyInOctave / TU::N_WHITEKEYS;
    wkeyInOctave %= TU::N_WHITEKEYS;
    int bkeyInOctave = 0;

    if (y < TU::BKEY_HEIGHT) {
        // check if the mouse is over a black key
        bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave];
        int wkeyx = x % TU::WKEY_WIDTH;

        if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx <= TU::BKEY_WIDTH_HALF) {
            // mouse is over the black key to the left of the white key
            isBlack = true;
        } else {
            // now check the right
            
            // get the black key to the left of the next white key
            bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave == TU::N_WHITEKEYS - 1 ? 0 : wkeyInOctave + 1];
            
            if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx >= TU::WKEY_WIDTH - TU::BKEY_WIDTH_HALF) {
                isBlack = true;
            }
        }
    }

    int note = octave * 12;
    if (isBlack) {
        note += TU::BLACKKEY_TO_NOTE[bkeyInOctave];
    } else {
        note += TU::WHITEKEY_TO_NOTE[wkeyInOctave];
    }

    return note;
}